

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockCallTest_threeExpectedAndActual_TestShell::createTest
          (TEST_MockCallTest_threeExpectedAndActual_TestShell *this)

{
  Utest *this_00;
  TEST_MockCallTest_threeExpectedAndActual_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
                                  ,0x156);
  TEST_MockCallTest_threeExpectedAndActual_Test::TEST_MockCallTest_threeExpectedAndActual_Test
            ((TEST_MockCallTest_threeExpectedAndActual_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockCallTest, threeExpectedAndActual)
{
    mock().expectOneCall("function1");
    mock().expectOneCall("function2");
    mock().expectOneCall("function3");
    mock().actualCall("function1");
    mock().actualCall("function2");
    mock().actualCall("function3");

    mock().checkExpectations();
}